

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChildKiller_impl.hpp
# Opt level: O2

void __thiscall
hiberlite::KillChildren::
act<hiberlite::AVisitor<hiberlite::KillChildren>,std::vector<int,std::allocator<int>>,hiberlite::stl_stream_adapter<std::vector<int,std::allocator<int>>,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>
          (KillChildren *this,AVisitor<hiberlite::KillChildren> *av,
          collection_nvp<std::vector<int,_std::allocator<int>_>,_hiberlite::stl_stream_adapter<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
          *nvp)

{
  KillChildren *pKVar1;
  AVisitor<hiberlite::KillChildren> *pAVar2;
  pointer plVar3;
  vector<int,_std::allocator<int>_> *_value;
  _Elt_pointer plVar4;
  long lVar5;
  ulong uVar6;
  allocator local_1ea;
  allocator local_1e9;
  KillChildren *local_1e8;
  AVisitor<hiberlite::KillChildren> *local_1e0;
  shared_connection local_1d8;
  shared_connection local_1c8;
  vector<long_long,_std::allocator<long_long>_> children;
  string tab;
  string local_180;
  string local_160;
  string local_140;
  sql_nvp<std::vector<int,_std::allocator<int>_>_> el;
  string local_d8;
  string local_b8;
  string local_98;
  sql_nvp<std::vector<int,_std::allocator<int>_>_> local_78;
  
  std::__cxx11::string::string((string *)&local_b8,(string *)nvp);
  AVisitor<hiberlite::KillChildren>::diveTable(av,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  Scope::Scope((Scope *)&el,&av->scope);
  std::__cxx11::string::string((string *)&tab,(string *)&el);
  Scope::~Scope((Scope *)&el);
  local_1c8._vptr_shared_res = (_func_int **)&PTR__shared_res_001bb598;
  local_1c8.res = (av->rootKey).con.res;
  if (local_1c8.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    (local_1c8.res)->refCount = (local_1c8.res)->refCount + 1;
  }
  local_1e0 = av;
  std::__cxx11::string::string((string *)&local_140,(string *)&tab);
  plVar4 = (this->rowId).c.super__Deque_base<long_long,_std::allocator<long_long>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (plVar4 == (this->rowId).c.super__Deque_base<long_long,_std::allocator<long_long>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    plVar4 = (this->rowId).c.super__Deque_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  Database::dbSelectChildIds(&children,&local_1c8,&local_140,plVar4[-1]);
  local_1e8 = this;
  std::__cxx11::string::~string((string *)&local_140);
  shared_res<hiberlite::autoclosed_con>::~shared_res(&local_1c8);
  lVar5 = 0;
  for (uVar6 = 0;
      plVar3 = children.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
               super__Vector_impl_data._M_start, pAVar2 = local_1e0,
      uVar6 < (ulong)((long)children.super__Vector_base<long_long,_std::allocator<long_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)children.super__Vector_base<long_long,_std::allocator<long_long>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3); uVar6 = uVar6 + 1) {
    _value = (vector<int,_std::allocator<int>_> *)operator_new(0x18);
    (_value->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    (_value->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    (_value->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::deque<long_long,_std::allocator<long_long>_>::push_back
              ((deque<long_long,_std::allocator<long_long>_> *)local_1e8,
               (value_type_conflict4 *)((long)plVar3 + lVar5));
    std::__cxx11::string::string((string *)&local_d8,"item",&local_1e9);
    std::__cxx11::string::string((string *)&local_98,"",&local_1ea);
    sql_nvp<std::vector<int,_std::allocator<int>_>_>::sql_nvp(&el,&local_d8,_value,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_d8);
    sql_nvp<std::vector<int,_std::allocator<int>_>_>::sql_nvp(&local_78,&el);
    AVisitor<hiberlite::KillChildren>::operator&(local_1e0,&local_78);
    pKVar1 = local_1e8;
    sql_nvp<std::vector<int,_std::allocator<int>_>_>::~sql_nvp(&local_78);
    std::deque<long_long,_std::allocator<long_long>_>::pop_back
              ((deque<long_long,_std::allocator<long_long>_> *)pKVar1);
    access::destroy<hiberlite::KillChildren,std::vector<int,std::allocator<int>>>(pKVar1,_value);
    sql_nvp<std::vector<int,_std::allocator<int>_>_>::~sql_nvp(&el);
    lVar5 = lVar5 + 8;
  }
  AVisitor<hiberlite::KillChildren>::popScope(local_1e0);
  pKVar1 = local_1e8;
  local_1d8._vptr_shared_res = (_func_int **)&PTR__shared_res_001bb598;
  local_1d8.res = (pAVar2->rootKey).con.res;
  if (local_1d8.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    (local_1d8.res)->refCount = (local_1d8.res)->refCount + 1;
  }
  std::__cxx11::string::string((string *)&local_160,(string *)&tab);
  std::__cxx11::string::string((string *)&local_180,"hiberlite_parent_id",(allocator *)&el);
  plVar4 = (pKVar1->rowId).c.super__Deque_base<long_long,_std::allocator<long_long>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (plVar4 == (pKVar1->rowId).c.super__Deque_base<long_long,_std::allocator<long_long>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    plVar4 = (pKVar1->rowId).c.super__Deque_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  Database::dbDeleteRows<long_long>(&local_1d8,&local_160,&local_180,plVar4[-1]);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_160);
  shared_res<hiberlite::autoclosed_con>::~shared_res(&local_1d8);
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
            (&children.super__Vector_base<long_long,_std::allocator<long_long>_>);
  std::__cxx11::string::~string((string *)&tab);
  return;
}

Assistant:

void KillChildren::act(AV& av, collection_nvp<E,S> nvp )
{
	av.diveTable(nvp.name);
		std::string tab=av.getScope().table();
		std::vector<sqlid_t> children=Database::dbSelectChildIds(av.getConnection(), tab, rowId.top());
		for(size_t i=0;i<children.size();i++){
			E* entry;
			construct(av,&entry,static_cast<unsigned int>(0));
				rowId.push(children[i]);
					sql_nvp<E> el("item",*entry);
					av & el;
				rowId.pop();
			destroy(*this, entry, static_cast<unsigned int>(0));
		}
	av.pop();

	Database::dbDeleteRows(av.getConnection(),tab,HIBERLITE_PARENTID_COLUMN,rowId.top());
}